

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcControl::~IfcControl(IfcControl *this)

{
  IfcObject::~IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__0072ddb0);
  return;
}

Assistant:

IfcControl() : Object("IfcControl") {}